

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O2

err_t rngESTest(char *source)

{
  err_t eVar1;
  bool_t bVar2;
  err_t eVar3;
  size_t read;
  octet buf [2500];
  size_t local_9e0;
  octet local_9d8 [2512];
  
  eVar1 = rngESRead(&local_9e0,local_9d8,0x9c4,source);
  eVar3 = 0xcf;
  if (local_9e0 == 0x9c4) {
    eVar3 = eVar1;
  }
  if (eVar1 != 0) {
    eVar3 = eVar1;
  }
  if (eVar3 != 0) {
    return eVar3;
  }
  bVar2 = rngTestFIPS1(local_9d8);
  if (((bVar2 != 0) && (bVar2 = rngTestFIPS2(local_9d8), bVar2 != 0)) &&
     (bVar2 = rngTestFIPS3(local_9d8), bVar2 != 0)) {
    bVar2 = rngTestFIPS4(local_9d8);
    eVar3 = 0;
    if (bVar2 != 0) goto LAB_00113aff;
  }
  eVar3 = 0x20b;
LAB_00113aff:
  memWipe(local_9d8,0x9c4);
  return eVar3;
}

Assistant:

err_t rngESTest(const char* source)
{
	err_t code;
	octet buf[2500];
	size_t read;
	// прочитать данные от источника
	code = rngESRead(&read, buf, 2500, source);
	if (code == ERR_OK && read != 2500)
		code = ERR_FILE_READ;
	ERR_CALL_CHECK(code);
	// статистическое тестирование
	if (!rngTestFIPS1(buf) || !rngTestFIPS2(buf) || !rngTestFIPS3(buf) ||
		!rngTestFIPS4(buf))
		code = ERR_STATTEST;
	// завершение
	memWipe(buf, sizeof(buf));
	return code;
}